

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSetStringSpan::~UnicodeSetStringSpan(UnicodeSetStringSpan *this)

{
  UnicodeSet *this_00;
  void *in_RSI;
  UnicodeSetStringSpan *this_local;
  
  if (((this->pSpanNotSet != (UnicodeSet *)0x0) && (this->pSpanNotSet != &this->spanSet)) &&
     (this_00 = this->pSpanNotSet, this_00 != (UnicodeSet *)0x0)) {
    UnicodeSet::~UnicodeSet(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  if ((this->utf8Lengths != (int32_t *)0x0) && (this->utf8Lengths != this->staticLengths)) {
    uprv_free_63(this->utf8Lengths);
  }
  UnicodeSet::~UnicodeSet(&this->spanSet);
  return;
}

Assistant:

UnicodeSetStringSpan::~UnicodeSetStringSpan() {
    if(pSpanNotSet!=NULL && pSpanNotSet!=&spanSet) {
        delete pSpanNotSet;
    }
    if(utf8Lengths!=NULL && utf8Lengths!=staticLengths) {
        uprv_free(utf8Lengths);
    }
}